

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O1

void __thiscall
checkqueue_tests::test_CheckQueue_Correct_Random::test_method(test_CheckQueue_Correct_Random *this)

{
  long lVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> range_00;
  BOOST_AUTO_TEST_CASE_FIXTURE *pBVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> range;
  undefined8 in_stack_ffffffffffffff78;
  pointer in_stack_ffffffffffffff88;
  pointer local_68;
  unsigned_long local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_58,100);
  local_60 = 2;
  pBVar2 = &this->super_BOOST_AUTO_TEST_CASE_FIXTURE;
  do {
    if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_58,
                 (iterator)
                 local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_60);
    }
    else {
      *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = local_60;
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar5 = 100000 - local_60;
    if (999 < uVar5) {
      uVar5 = 1000;
    }
    uVar5 = uVar5 - 1;
    if (uVar5 == 0) {
      uVar3 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar3 = (uint)lVar1 ^ 0x3f;
    }
    do {
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        (&(pBVar2->super_NoLockLoggingTestingSetup).super_TestingSetup.
                          super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                          super_RandomMixin<FastRandomContext>,0x40 - uVar3);
    } while (uVar5 < uVar4);
    local_60 = uVar4 + (uVar4 == 0) + local_60;
  } while (local_60 < 100000);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff88,
             &local_58);
  range_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)this;
  range_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff78;
  range_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff88;
  CheckQueueTest::Correct_Queue_range(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,range_00);
  if (in_stack_ffffffffffffff88 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffff88,(long)local_68 - (long)in_stack_ffffffffffffff88);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Correct_Random)
{
    std::vector<size_t> range;
    range.reserve(100000/1000);
    for (size_t i = 2; i < 100000; i += std::max((size_t)1, (size_t)m_rng.randrange(std::min((size_t)1000, ((size_t)100000) - i))))
        range.push_back(i);
    Correct_Queue_range(range);
}